

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::removeOcclusionQuery(COpenGLDriver *this,ISceneNode *node)

{
  s32 sVar1;
  SOccQuery *pSVar2;
  CNullDriver *in_RSI;
  SOccQuery *in_RDI;
  s32 index;
  undefined8 in_stack_ffffffffffffffa8;
  anon_union_8_2_439e2c06_for_SOccQuery_2 *node_00;
  GLsizei n;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SOccQuery *in_stack_ffffffffffffffd0;
  array<irr::video::CNullDriver::SOccQuery> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  node_00 = &in_RDI[1].field_2;
  CNullDriver::SOccQuery::SOccQuery
            ((SOccQuery *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (ISceneNode *)node_00,(IMesh *)in_RDI);
  n = (GLsizei)((ulong)node_00 >> 0x20);
  sVar1 = core::array<irr::video::CNullDriver::SOccQuery>::linear_search
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  CNullDriver::SOccQuery::~SOccQuery(in_RDI);
  if (sVar1 != -1) {
    iVar3 = sVar1;
    pSVar2 = core::array<irr::video::CNullDriver::SOccQuery>::operator[]
                       ((array<irr::video::CNullDriver::SOccQuery> *)in_RDI,
                        (u32)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if ((pSVar2->field_2).UID != 0) {
      core::array<irr::video::CNullDriver::SOccQuery>::operator[]
                ((array<irr::video::CNullDriver::SOccQuery> *)in_RDI,
                 (u32)((ulong)&in_RDI[0x24].Result >> 0x20));
      COpenGLExtensionHandler::extGlDeleteQueries
                ((COpenGLExtensionHandler *)CONCAT44(sVar1,in_stack_ffffffffffffffc0),n,
                 (GLuint *)in_RDI);
    }
    CNullDriver::removeOcclusionQuery
              (in_RSI,(ISceneNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void COpenGLDriver::removeOcclusionQuery(scene::ISceneNode *node)
{
	const s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index != -1) {
		if (OcclusionQueries[index].UID != 0)
			extGlDeleteQueries(1, reinterpret_cast<GLuint *>(&OcclusionQueries[index].UID));
		CNullDriver::removeOcclusionQuery(node);
	}
}